

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHeader.cpp
# Opt level: O0

void __thiscall Imf_3_3::Header::Header(Header *this,Header *other)

{
  bool bVar1;
  pointer this_00;
  long in_RSI;
  void *in_RDI;
  const_iterator i;
  Header *in_stack_00000048;
  Header *in_stack_00000050;
  Attribute *in_stack_000005a0;
  char *in_stack_000005a8;
  Header *in_stack_000005b0;
  map<Imf_3_3::Name,_Imf_3_3::Attribute_*,_std::less<Imf_3_3::Name>,_std::allocator<std::pair<const_Imf_3_3::Name,_Imf_3_3::Attribute_*>_>_>
  *in_stack_ffffffffffffffb8;
  _Rb_tree_const_iterator<std::pair<const_Imf_3_3::Name,_Imf_3_3::Attribute_*>_>
  *in_stack_ffffffffffffffc0;
  _Self local_20;
  _Self local_18;
  long local_10;
  
  local_10 = in_RSI;
  memset(in_RDI,0,0x30);
  std::
  map<Imf_3_3::Name,_Imf_3_3::Attribute_*,_std::less<Imf_3_3::Name>,_std::allocator<std::pair<const_Imf_3_3::Name,_Imf_3_3::Attribute_*>_>_>
  ::map((map<Imf_3_3::Name,_Imf_3_3::Attribute_*,_std::less<Imf_3_3::Name>,_std::allocator<std::pair<const_Imf_3_3::Name,_Imf_3_3::Attribute_*>_>_>
         *)0x11976e);
  *(byte *)((long)in_RDI + 0x30) = *(byte *)(local_10 + 0x30) & 1;
  local_18._M_node =
       (_Base_ptr)
       std::
       map<Imf_3_3::Name,_Imf_3_3::Attribute_*,_std::less<Imf_3_3::Name>,_std::allocator<std::pair<const_Imf_3_3::Name,_Imf_3_3::Attribute_*>_>_>
       ::begin(in_stack_ffffffffffffffb8);
  while( true ) {
    local_20._M_node =
         (_Base_ptr)
         std::
         map<Imf_3_3::Name,_Imf_3_3::Attribute_*,_std::less<Imf_3_3::Name>,_std::allocator<std::pair<const_Imf_3_3::Name,_Imf_3_3::Attribute_*>_>_>
         ::end(in_stack_ffffffffffffffb8);
    bVar1 = std::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    this_00 = std::_Rb_tree_const_iterator<std::pair<const_Imf_3_3::Name,_Imf_3_3::Attribute_*>_>::
              operator->(in_stack_ffffffffffffffc0);
    in_stack_ffffffffffffffc0 =
         (_Rb_tree_const_iterator<std::pair<const_Imf_3_3::Name,_Imf_3_3::Attribute_*>_> *)
         Name::operator*(&this_00->first);
    std::_Rb_tree_const_iterator<std::pair<const_Imf_3_3::Name,_Imf_3_3::Attribute_*>_>::operator->
              (in_stack_ffffffffffffffc0);
    insert(in_stack_000005b0,in_stack_000005a8,in_stack_000005a0);
    std::_Rb_tree_const_iterator<std::pair<const_Imf_3_3::Name,_Imf_3_3::Attribute_*>_>::operator++
              (in_stack_ffffffffffffffc0);
  }
  anon_unknown_1::copyCompressionRecord(in_stack_00000050,in_stack_00000048);
  return;
}

Assistant:

Header::Header (const Header& other)
    : _map (), _readsNothing (other._readsNothing)
{
    for (AttributeMap::const_iterator i = other._map.begin ();
         i != other._map.end ();
         ++i)
    {
        insert (*i->first, *i->second);
    }
    copyCompressionRecord (this, &other);
}